

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_extrude.cpp
# Opt level: O0

int ON_BrepConeEdge(ON_Brep *brep,int edge_index,ON_3dPoint apex_point)

{
  int iVar1;
  ON_BrepEdge *pOVar2;
  ON_NurbsSurface *pSurface;
  ON_BrepFace *pOVar3;
  bool local_4c [4];
  int local_48;
  bool bRev3d [4];
  int eid [4];
  int vid [4];
  ON_NurbsSurface *cone_srf;
  int edge_index_local;
  ON_Brep *brep_local;
  
  if ((edge_index < 0) &&
     (iVar1 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&brep->m_E),
     iVar1 <= edge_index)) {
    return 0;
  }
  pOVar2 = ON_ClassArray<ON_BrepEdge>::operator[]
                     ((ON_ClassArray<ON_BrepEdge> *)&brep->m_E,edge_index);
  pSurface = ON_BrepExtrudeHelper_MakeConeSrf(&apex_point,pOVar2,false);
  if (pSurface == (ON_NurbsSurface *)0x0) {
    brep_local._4_4_ = 0;
  }
  else {
    pOVar2 = ON_ClassArray<ON_BrepEdge>::operator[]
                       ((ON_ClassArray<ON_BrepEdge> *)&brep->m_E,edge_index);
    eid[2] = pOVar2->m_vi[0];
    pOVar2 = ON_ClassArray<ON_BrepEdge>::operator[]
                       ((ON_ClassArray<ON_BrepEdge> *)&brep->m_E,edge_index);
    eid[3] = pOVar2->m_vi[1];
    bRev3d[0] = true;
    bRev3d[1] = true;
    bRev3d[2] = true;
    bRev3d[3] = true;
    eid[0] = -1;
    eid[1] = -1;
    local_4c[0] = false;
    local_4c[1] = false;
    local_4c[2] = false;
    local_4c[3] = false;
    local_48 = edge_index;
    pOVar3 = ON_Brep::NewFace(brep,&pSurface->super_ON_Surface,eid + 2,&local_48,local_4c);
    brep_local._4_4_ = (uint)(-(pOVar3 != (ON_BrepFace *)0x0) & 1);
  }
  return brep_local._4_4_;
}

Assistant:

int ON_BrepConeEdge( 
          ON_Brep& brep,
          int edge_index,
          ON_3dPoint apex_point
          )
{
  //ON_3dVector path_vector;

  if ( edge_index < 0 && edge_index >= brep.m_E.Count() )
    return false;

  // make sides
  ON_NurbsSurface* cone_srf = ON_BrepExtrudeHelper_MakeConeSrf( 
                              apex_point, brep.m_E[edge_index], false );

  if ( !cone_srf )
    return false;

  int vid[4], eid[4];
  bool bRev3d[4];

  vid[0] = brep.m_E[edge_index].m_vi[0];
  vid[1] = brep.m_E[edge_index].m_vi[1];
  vid[2] = -1;
  vid[3] = -1;

  eid[0] = edge_index;
  eid[1] = -1;
  eid[2] = -1;
  eid[3] = -1;

  bRev3d[0] = false;
  bRev3d[1] = false;
  bRev3d[2] = false;
  bRev3d[3] = false;

  return brep.NewFace( cone_srf, vid, eid, bRev3d ) ? true : false;
}